

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O2

void FastestHash_test(void *key,int len,uint32_t seed,void *out)

{
  ulong uVar1;
  uint64_t uVar2;
  
  if ((uint)len < 4) {
    if (len == 0) {
      uVar1 = 0;
    }
    else {
      uVar2 = _wyr3((uint8_t *)key,len);
      uVar1 = uVar2 ^ seed;
    }
  }
  else {
    uVar1 = (ulong)len;
    uVar1 = (ulong)(seed ^ *key) ^ (ulong)*(uint *)((long)key + ((uVar1 >> 1) - 2)) + (ulong)seed ^
            (ulong)*(uint *)((long)key + (uVar1 - 4)) +
            (ulong)*(uint *)((long)key + ((uVar1 >> 2) - 1));
  }
  *(ulong *)out = uVar1;
  return;
}

Assistant:

inline void FastestHash_test (const void * key, int len, uint32_t seed, void * out) {
  *(uint64_t*)out = FastestHash(key, (size_t)len, (uint64_t)seed);
}